

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcaches_destroy(tsd_t *tsd,uint ind)

{
  anon_union_8_2_150e8edc_for_tcaches_s_0 *paVar1;
  tcaches_t tcache;
  int iVar2;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&tcaches_mtx);
  }
  tcaches_mtx.field_0.field_0.prof_data.n_lock_ops =
       tcaches_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(tcaches_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    tcaches_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(tcaches_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    tcaches_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  paVar1 = &duckdb_je_tcaches[ind].field_0;
  tcache.field_0 = (anon_union_8_2_150e8edc_for_tcaches_s_0)paVar1->tcache;
  paVar1->next = tcaches_avail;
  tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  tcaches_avail = (tcaches_t *)paVar1;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if ((ulong)tcache.field_0 < (tcache_t *)0x2) {
    return;
  }
  tcache_destroy(tsd,(tcache_t *)tcache.field_0,false);
  return;
}

Assistant:

void
tcaches_destroy(tsd_t *tsd, unsigned ind) {
	malloc_mutex_lock(tsd_tsdn(tsd), &tcaches_mtx);
	tcaches_t *elm = &tcaches[ind];
	tcache_t *tcache = tcaches_elm_remove(tsd, elm, false);
	elm->next = tcaches_avail;
	tcaches_avail = elm;
	malloc_mutex_unlock(tsd_tsdn(tsd), &tcaches_mtx);
	if (tcache != NULL) {
		tcache_destroy(tsd, tcache, false);
	}
}